

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  long lVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  statusline sVar6;
  CURLofft CVar7;
  CURLcode CVar8;
  void *pvVar9;
  time_t tVar10;
  char *pcVar11;
  bool bVar12;
  char *local_100;
  char *local_d8;
  char *location;
  char *auth;
  time_t tStack_b0;
  _Bool proxy;
  time_t secs;
  char *ptr;
  char *contenttype;
  long lStack_90;
  CURLofft offt;
  curl_off_t contentlength;
  char separator_1;
  int iStack_80;
  char separator;
  int nc;
  int rtspversion_major;
  int httpversion_major;
  size_t headerlen;
  statusline local_68;
  statusline st_1;
  statusline st;
  int writetype;
  size_t full_length;
  size_t rest_length;
  char *ostr;
  ssize_t onread;
  SingleRequest *k;
  _Bool *p_Stack_30;
  CURLcode result;
  _Bool *stop_reading_local;
  ssize_t *nread_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  onread = (ssize_t)&data->req;
  ostr = (char *)*nread;
  rest_length = (size_t)(data->req).str;
  p_Stack_30 = stop_reading;
  stop_reading_local = (_Bool *)nread;
  nread_local = (ssize_t *)conn;
  conn_local = (connectdata *)data;
  do {
    *(undefined8 *)(onread + 0x70) = *(undefined8 *)(onread + 0x68);
    pvVar9 = memchr(*(void **)(onread + 0x70),10,*(size_t *)stop_reading_local);
    *(void **)(onread + 0x78) = pvVar9;
    if (*(long *)(onread + 0x78) == 0) {
      k._4_4_ = header_append((Curl_easy *)conn_local,(SingleRequest *)onread,
                              *(size_t *)stop_reading_local);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      if (*(int *)(onread + 0x54) != 0) {
        return CURLE_OK;
      }
      local_68 = checkprotoprefix((Curl_easy *)conn_local,(connectdata *)nread_local,
                                  (char *)conn_local[2].easyq.tail,*(size_t *)(onread + 0x60));
      if (local_68 != STATUS_BAD) {
        return CURLE_OK;
      }
      *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe;
      *(undefined4 *)(onread + 0x50) = 2;
      Curl_conncontrol((connectdata *)nread_local,2);
      if (((ulong)conn_local[2].recv[0] >> 0x39 & 1) != 0) {
        return CURLE_OK;
      }
      Curl_failf((Curl_easy *)conn_local,"Received HTTP/0.9 when not allowed\n");
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    full_length = (*(long *)(onread + 0x78) - *(long *)(onread + 0x68)) + 1;
    *(size_t *)stop_reading_local = *(long *)stop_reading_local - full_length;
    *(long *)(onread + 0x68) = *(long *)(onread + 0x78) + 1;
    _st = *(long *)(onread + 0x68) - *(long *)(onread + 0x70);
    k._4_4_ = header_append((Curl_easy *)conn_local,(SingleRequest *)onread,_st);
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
    *(undefined8 *)(onread + 0x78) = *(undefined8 *)(onread + 0x58);
    *(curl_llist_element **)(onread + 0x80) = conn_local[2].easyq.tail;
    if ((*(int *)(onread + 0x54) == 0) &&
       (headerlen._4_4_ =
             checkprotoprefix((Curl_easy *)conn_local,(connectdata *)nread_local,
                              (char *)conn_local[2].easyq.tail,*(size_t *)(onread + 0x60)),
       headerlen._4_4_ == STATUS_BAD)) {
      Curl_conncontrol((connectdata *)nread_local,2);
      if (((ulong)conn_local[2].recv[0] >> 0x39 & 1) == 0) {
        Curl_failf((Curl_easy *)conn_local,"Received HTTP/0.9 when not allowed\n");
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe;
      if (*(long *)stop_reading_local != 0) {
        *(undefined4 *)(onread + 0x50) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)(onread + 0x50) = 2;
      *(char **)stop_reading_local = ostr;
      *(size_t *)(onread + 0x68) = rest_length;
      return CURLE_OK;
    }
    if ((**(char **)(onread + 0x80) == '\n') || (**(char **)(onread + 0x80) == '\r')) {
      if (**(char **)(onread + 0x80) == '\r') {
        *(long *)(onread + 0x80) = *(long *)(onread + 0x80) + 1;
      }
      if (**(char **)(onread + 0x80) == '\n') {
        *(long *)(onread + 0x80) = *(long *)(onread + 0x80) + 1;
      }
      if ((*(int *)(onread + 0x90) < 100) || (199 < *(int *)(onread + 0x90))) {
        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe;
        if ((*(long *)onread == -1) &&
           (((((*(ushort *)(onread + 0x570) >> 5 & 1) == 0 &&
              ((*(uint *)((long)nread_local + 0x3ac) & 1) == 0)) && ((int)nread_local[0x46] == 0xb))
            && (((*(uint *)(nread_local[0x7a] + 0x80) & 0x40000) == 0 &&
                (*(int *)&conn_local[1].allocptr.proxyuserpwd != 6)))))) {
          Curl_infof((Curl_easy *)conn_local,
                     "no chunk, no close, no size. Assume close to signal end\n");
          Curl_conncontrol((connectdata *)nread_local,2);
        }
      }
      else if (*(int *)(onread + 0x90) == 100) {
        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe | 1;
        *(undefined4 *)(onread + 0x54) = 0;
        if (*(int *)(onread + 0xa8) != 0) {
          *(undefined4 *)(onread + 0xa8) = 0;
          *(uint *)(onread + 0xd0) = *(uint *)(onread + 0xd0) | 2;
          Curl_expire_done((Curl_easy *)conn_local,EXPIRE_100_TIMEOUT);
        }
      }
      else if (*(int *)(onread + 0x90) == 0x65) {
        if (*(int *)(onread + 0xac) == 1) {
          Curl_infof((Curl_easy *)conn_local,"Received 101\n");
          *(undefined4 *)(onread + 0xac) = 2;
          *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe | 1;
          *(undefined4 *)(onread + 0x54) = 0;
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe;
      }
      else {
        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe | 1;
        *(undefined4 *)(onread + 0x54) = 0;
      }
      if (((*(uint *)((long)nread_local + 0x3ac) & 1) != 0) &&
         (((*(int *)&(conn_local->http_proxy).user == 0x191 && ((int)nread_local[0x91] == 2)) ||
          ((*(int *)&(conn_local->http_proxy).user == 0x197 &&
           (*(int *)((long)nread_local + 0x48c) == 2)))))) {
        Curl_infof((Curl_easy *)conn_local,"Connection closure while negotiating auth (HTTP 1.0?)\n"
                  );
        *(ushort *)((long)&conn_local[3].proxy_ssl[1].backend + 4) =
             *(ushort *)((long)&conn_local[3].proxy_ssl[1].backend + 4) & 0xffdf | 0x20;
      }
      iVar5 = http_should_fail((connectdata *)nread_local);
      if (iVar5 != 0) {
        Curl_failf((Curl_easy *)conn_local,"The requested URL returned error: %d",
                   (ulong)*(uint *)(onread + 0x90));
        return CURLE_HTTP_RETURNED_ERROR;
      }
      st_1 = STATUS_BAD;
      if (((ulong)conn_local[2].recv[0] >> 0x19 & 1) != 0) {
        st_1 = STATUS_BAD|STATUS_DONE;
      }
      _rtspversion_major = *(long *)(onread + 0x80) - (long)conn_local[2].easyq.tail;
      k._4_4_ = Curl_client_write((connectdata *)nread_local,st_1,(char *)conn_local[2].easyq.tail,
                                  _rtspversion_major);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      conn_local[3].proxy_ssl_config.version_max =
           _rtspversion_major + conn_local[3].proxy_ssl_config.version_max;
      (conn_local->socks_proxy).host.rawalloc =
           (conn_local->socks_proxy).host.rawalloc + _rtspversion_major;
      if ((*(int *)(onread + 0x90) < 100) || (199 < *(int *)(onread + 0x90))) {
        local_d8 = (char *)0x0;
      }
      else {
        local_d8 = (conn_local->socks_proxy).host.rawalloc;
      }
      (conn_local->socks_proxy).host.encalloc = local_d8;
      k._4_4_ = Curl_http_auth_act((connectdata *)nread_local);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      if (299 < *(int *)(onread + 0x90)) {
        if (((((*(uint *)((long)nread_local + 0x3ac) >> 0xf & 1) == 0) &&
             ((*(uint *)((long)nread_local + 0x3ac) & 1) == 0)) &&
            ((*(uint *)((long)nread_local + 0x3ac) >> 0x10 & 1) == 0)) &&
           ((*(int *)&conn_local[1].allocptr.proxyuserpwd - 2U < 4 &&
            (Curl_expire_done((Curl_easy *)conn_local,EXPIRE_100_TIMEOUT),
            (*(ushort *)(onread + 0x570) >> 2 & 1) == 0)))) {
          if (((ulong)conn_local[2].recv[0] >> 0x15 & 1) == 0) {
            Curl_infof((Curl_easy *)conn_local,"HTTP error before end of send, stop sending\n");
            Curl_conncontrol((connectdata *)nread_local,2);
            *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffb | 4;
            *(uint *)(onread + 0xd0) = *(uint *)(onread + 0xd0) & 0xfffffffd;
            if ((*(ushort *)((long)&conn_local[3].proxy_ssl[1].backend + 4) >> 8 & 1) != 0) {
              *(undefined4 *)(onread + 0xa8) = 3;
            }
          }
          else {
            Curl_infof((Curl_easy *)conn_local,"HTTP error before end of send, keep sending\n");
            if (*(int *)(onread + 0xa8) != 0) {
              *(undefined4 *)(onread + 0xa8) = 0;
              *(uint *)(onread + 0xd0) = *(uint *)(onread + 0xd0) | 2;
            }
          }
        }
        if ((*(uint *)((long)nread_local + 0x3ac) >> 0x10 & 1) != 0) {
          Curl_infof((Curl_easy *)conn_local,"Keep sending data to get tossed away!\n");
          *(uint *)(onread + 0xd0) = *(uint *)(onread + 0xd0) | 2;
        }
      }
      if ((*(ushort *)(onread + 0x570) & 1) == 0) {
        if (((ulong)conn_local[2].recv[0] >> 0x1c & 1) == 0) {
          if ((*(ushort *)(onread + 0x570) >> 5 & 1) != 0) {
            *(undefined8 *)onread = 0xffffffffffffffff;
            *(undefined8 *)(onread + 8) = 0xffffffffffffffff;
          }
        }
        else {
          *p_Stack_30 = true;
        }
        if (*(long *)onread != -1) {
          Curl_pgrsSetDownloadSize((Curl_easy *)conn_local,*(curl_off_t *)onread);
          *(undefined8 *)(onread + 8) = *(undefined8 *)onread;
        }
        if (*(long *)(onread + 8) == 0) {
          *p_Stack_30 = true;
        }
        if ((*p_Stack_30 & 1U) != 0) {
          *(uint *)(onread + 0xd0) = *(uint *)(onread + 0xd0) & 0xfffffffe;
        }
        if (((ulong)conn_local[2].recv[0] >> 0x1e & 1) == 0) {
          return CURLE_OK;
        }
        Curl_debug((Curl_easy *)conn_local,CURLINFO_HEADER_IN,*(char **)(onread + 0x70),
                   _rtspversion_major);
        return CURLE_OK;
      }
      *(curl_llist_element **)(onread + 0x58) = conn_local[2].easyq.tail;
      *(undefined8 *)(onread + 0x60) = 0;
    }
    else {
      iVar5 = *(int *)(onread + 0x54);
      *(int *)(onread + 0x54) = iVar5 + 1;
      if (iVar5 == 0) {
        contentlength._4_4_ = 0;
        if ((*(uint *)(nread_local[0x7a] + 0x80) & 3) == 0) {
          if ((*(uint *)(nread_local[0x7a] + 0x80) & 0x40000) != 0) {
            iVar5 = __isoc99_sscanf(*(undefined8 *)(onread + 0x80)," RTSP/%1d.%1d%c%3d",
                                    &stack0xffffffffffffff80,(long)nread_local + 0x234,
                                    (long)&contentlength + 2,onread + 0x90);
            if ((iVar5 == 4) && (contentlength._2_1_ == ' ')) {
              *(int *)((long)nread_local + 0x234) =
                   iStack_80 * 10 + *(int *)((long)nread_local + 0x234);
              *(undefined4 *)(nread_local + 0x46) = 0xb;
              contentlength._4_4_ = 4;
            }
            else {
              contentlength._4_4_ = 0;
            }
          }
        }
        else {
          contentlength._4_4_ =
               __isoc99_sscanf(*(undefined8 *)(onread + 0x80)," HTTP/%1d.%1d%c%3d",&nc,
                               nread_local + 0x46,(long)&contentlength + 3,onread + 0x90);
          if (((contentlength._4_4_ == 1) && (nc == 2)) &&
             (iVar5 = __isoc99_sscanf(*(undefined8 *)(onread + 0x80)," HTTP/2 %d",onread + 0x90),
             iVar5 == 1)) {
            *(undefined4 *)(nread_local + 0x46) = 0;
            contentlength._4_4_ = 4;
            contentlength._3_1_ = ' ';
          }
          if ((contentlength._4_4_ == 4) && (contentlength._3_1_ == ' ')) {
            *(int *)(nread_local + 0x46) = nc * 10 + (int)nread_local[0x46];
            if ((*(int *)(onread + 0xac) == 2) && ((int)nread_local[0x46] != 0x14)) {
              Curl_infof((Curl_easy *)conn_local,"Lying server, not serving HTTP/2\n");
            }
            if ((int)nread_local[0x46] < 0x14) {
              *(undefined4 *)nread_local[0xc4] = 0xffffffff;
              Curl_infof((Curl_easy *)conn_local,"Mark bundle as not supporting multiuse\n");
            }
          }
          else {
            if (contentlength._4_4_ != 0) {
              Curl_failf((Curl_easy *)conn_local,"Unsupported HTTP version in response\n");
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            contentlength._4_4_ =
                 __isoc99_sscanf(*(undefined8 *)(onread + 0x80)," HTTP %3d",onread + 0x90);
            *(undefined4 *)(nread_local + 0x46) = 10;
            if ((contentlength._4_4_ == 0) &&
               (sVar6 = checkhttpprefix((Curl_easy *)conn_local,*(char **)(onread + 0x80),
                                        *(size_t *)(onread + 0x60)), sVar6 == STATUS_DONE)) {
              contentlength._4_4_ = 1;
              *(undefined4 *)(onread + 0x90) = 200;
              *(undefined4 *)(nread_local + 0x46) = 10;
            }
          }
        }
        if (contentlength._4_4_ == 0) {
          *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffe;
          return CURLE_OK;
        }
        *(undefined4 *)&conn_local[3].ssl_config.cipher_list13 = *(undefined4 *)(onread + 0x90);
        *(int *)&conn_local[3].ssl_config.field_0x48 = (int)nread_local[0x46];
        if ((conn_local[3].httpversion == 0) || ((int)nread_local[0x46] < conn_local[3].httpversion)
           ) {
          conn_local[3].httpversion = (int)nread_local[0x46];
        }
        if (((conn_local[3].created.tv_sec == 0) ||
            (*(int *)&conn_local[1].allocptr.proxyuserpwd != 1)) ||
           (*(int *)(onread + 0x90) != 0x1a0)) {
          if ((((((ulong)conn_local[2].recv[0] >> 0x14 & 1) != 0) && (399 < *(int *)(onread + 0x90))
               ) && ((*(int *)(onread + 0x90) != 0x191 ||
                     ((*(uint *)((long)nread_local + 0x3ac) >> 7 & 1) == 0)))) &&
             ((*(int *)(onread + 0x90) != 0x197 ||
              ((*(uint *)((long)nread_local + 0x3ac) >> 8 & 1) == 0)))) {
            print_http_error((Curl_easy *)conn_local);
            return CURLE_HTTP_RETURNED_ERROR;
          }
        }
        else {
          *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfff7 | 8;
        }
        if ((int)nread_local[0x46] == 10) {
          Curl_infof((Curl_easy *)conn_local,"HTTP 1.0, assume close after body\n");
          Curl_conncontrol((connectdata *)nread_local,1);
        }
        else if (((int)nread_local[0x46] == 0x14) ||
                ((*(int *)(onread + 0xac) == 1 && (*(int *)(onread + 0x90) == 0x65)))) {
          *(undefined4 *)nread_local[0xc4] = 2;
        }
        if (*(int *)(onread + 0x90) != 0xcc) {
          if (*(int *)(onread + 0x90) != 0x130) goto LAB_008d7afa;
          if ((int)conn_local[1].upkeep_interval_ms != 0) {
            *(byte *)&conn_local[3].allocptr.rangeline =
                 *(byte *)&conn_local[3].allocptr.rangeline & 0xfe | 1;
          }
        }
        *(undefined8 *)onread = 0;
        *(undefined8 *)(onread + 8) = 0;
        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xffef | 0x10;
      }
LAB_008d7afa:
      k._4_4_ = CURLE_OK;
      if ((((*(ushort *)(onread + 0x570) >> 4 & 1) == 0) &&
          (((ulong)conn_local[2].recv[0] >> 0x24 & 1) == 0)) &&
         (iVar5 = curl_strnequal("Content-Length:",*(char **)(onread + 0x80),0xf), iVar5 != 0)) {
        contenttype._4_4_ =
             curlx_strtoofft((char *)(*(long *)(onread + 0x80) + 0xf),(char **)0x0,10,
                             &stack0xffffffffffffff70);
        if (contenttype._4_4_ == CURL_OFFT_OK) {
          lVar1._0_4_ = *(uint *)((long)&conn_local[1].proto + 0x98);
          lVar1._4_4_ = *(uint *)((long)&conn_local[1].proto + 0x9c);
          if ((lVar1 != 0) &&
             (lVar2._0_4_ = *(uint *)((long)&conn_local[1].proto + 0x98),
             lVar2._4_4_ = *(uint *)((long)&conn_local[1].proto + 0x9c), lVar2 < lStack_90)) {
            Curl_failf((Curl_easy *)conn_local,"Maximum file size exceeded");
            return CURLE_FILESIZE_EXCEEDED;
          }
          *(long *)onread = lStack_90;
          *(undefined8 *)(onread + 8) = *(undefined8 *)onread;
          Curl_pgrsSetDownloadSize((Curl_easy *)conn_local,*(curl_off_t *)onread);
        }
        else {
          if (contenttype._4_4_ != CURL_OFFT_FLOW) {
            Curl_failf((Curl_easy *)conn_local,"Invalid Content-Length: value");
            return CURLE_WEIRD_SERVER_REPLY;
          }
          lVar3._0_4_ = *(uint *)((long)&conn_local[1].proto + 0x98);
          lVar3._4_4_ = *(uint *)((long)&conn_local[1].proto + 0x9c);
          if (lVar3 != 0) {
            Curl_failf((Curl_easy *)conn_local,"Maximum file size exceeded");
            return CURLE_FILESIZE_EXCEEDED;
          }
          Curl_conncontrol((connectdata *)nread_local,2);
          Curl_infof((Curl_easy *)conn_local,"Overflow Content-Length: value!\n");
        }
      }
      else {
        iVar5 = curl_strnequal("Content-Type:",*(char **)(onread + 0x80),0xd);
        if (iVar5 == 0) {
          if ((((int)nread_local[0x46] == 10) &&
              ((*(uint *)((long)nread_local + 0x3ac) >> 5 & 1) != 0)) &&
             (_Var4 = Curl_compareheader(*(char **)(onread + 0x80),"Proxy-Connection:","keep-alive")
             , _Var4)) {
            Curl_conncontrol((connectdata *)nread_local,0);
            Curl_infof((Curl_easy *)conn_local,"HTTP/1.0 proxy connection set to keep alive!\n");
          }
          else if ((((int)nread_local[0x46] == 0xb) &&
                   ((*(uint *)((long)nread_local + 0x3ac) >> 5 & 1) != 0)) &&
                  (_Var4 = Curl_compareheader(*(char **)(onread + 0x80),"Proxy-Connection:","close")
                  , _Var4)) {
            Curl_conncontrol((connectdata *)nread_local,1);
            Curl_infof((Curl_easy *)conn_local,"HTTP/1.1 proxy connection set close!\n");
          }
          else if (((int)nread_local[0x46] == 10) &&
                  (_Var4 = Curl_compareheader(*(char **)(onread + 0x80),"Connection:","keep-alive"),
                  _Var4)) {
            Curl_conncontrol((connectdata *)nread_local,0);
            Curl_infof((Curl_easy *)conn_local,"HTTP/1.0 connection set to keep alive!\n");
          }
          else {
            _Var4 = Curl_compareheader(*(char **)(onread + 0x80),"Connection:","close");
            if (_Var4) {
              Curl_conncontrol((connectdata *)nread_local,2);
            }
            else {
              iVar5 = curl_strnequal("Transfer-Encoding:",*(char **)(onread + 0x80),0x12);
              if (iVar5 == 0) {
                iVar5 = curl_strnequal("Content-Encoding:",*(char **)(onread + 0x80),0x11);
                if ((iVar5 == 0) || (conn_local[2].bundle_node.ptr == (void *)0x0)) {
                  iVar5 = curl_strnequal("Content-Range:",*(char **)(onread + 0x80),0xe);
                  if (iVar5 == 0) {
                    if ((*(long *)&conn_local[2].ssl[0].field_0x10 == 0) ||
                       (iVar5 = curl_strnequal("Set-Cookie:",*(char **)(onread + 0x80),0xb),
                       iVar5 == 0)) {
                      iVar5 = curl_strnequal("Last-Modified:",*(char **)(onread + 0x80),0xe);
                      if ((iVar5 == 0) ||
                         (((int)conn_local[1].upkeep_interval_ms == 0 &&
                          (((ulong)conn_local[2].recv[0] >> 9 & 1) == 0)))) {
                        iVar5 = curl_strnequal("WWW-Authenticate:",*(char **)(onread + 0x80),0x11);
                        if (((iVar5 == 0) || (*(int *)(onread + 0x90) != 0x191)) &&
                           ((iVar5 = curl_strnequal("Proxy-authenticate:",*(char **)(onread + 0x80),
                                                    0x13), iVar5 == 0 ||
                            (*(int *)(onread + 0x90) != 0x197)))) {
                          if ((((*(int *)(onread + 0x90) < 300) || (399 < *(int *)(onread + 0x90)))
                              || (iVar5 = curl_strnequal("Location:",*(char **)(onread + 0x80),9),
                                 iVar5 == 0)) || (*(long *)(conn_local->primary_ip + 0x26) != 0)) {
                            if ((*(uint *)(nread_local[0x7a] + 0x80) & 0x40000) != 0) {
                              return CURLE_NOT_BUILT_IN;
                            }
                          }
                          else {
                            pcVar11 = Curl_copy_header_value(*(char **)(onread + 0x80));
                            if (pcVar11 == (char *)0x0) {
                              return CURLE_OUT_OF_MEMORY;
                            }
                            if (*pcVar11 == '\0') {
                              (*Curl_cfree)(pcVar11);
                            }
                            else {
                              *(char **)(conn_local->primary_ip + 0x26) = pcVar11;
                              if (((ulong)conn_local[2].recv[0] >> 0x16 & 1) != 0) {
                                pcVar11 = (*Curl_cstrdup)(*(char **)(conn_local->primary_ip + 0x26))
                                ;
                                conn_local->primary_port = (long)pcVar11;
                                if (conn_local->primary_port == 0) {
                                  return CURLE_OUT_OF_MEMORY;
                                }
                                CVar8 = http_perhapsrewind((connectdata *)nread_local);
                                if (CVar8 != CURLE_OK) {
                                  return CVar8;
                                }
                                k._4_4_ = CURLE_OK;
                              }
                            }
                          }
                        }
                        else {
                          iVar5 = *(int *)(onread + 0x90);
                          pcVar11 = Curl_copy_header_value(*(char **)(onread + 0x80));
                          if (pcVar11 == (char *)0x0) {
                            return CURLE_OUT_OF_MEMORY;
                          }
                          k._4_4_ = Curl_http_input_auth
                                              ((connectdata *)nread_local,iVar5 == 0x197,pcVar11);
                          (*Curl_cfree)(pcVar11);
                          if (k._4_4_ != CURLE_OK) {
                            return k._4_4_;
                          }
                        }
                      }
                      else {
                        tStack_b0 = time((time_t *)0x0);
                        tVar10 = curl_getdate((char *)(*(long *)(onread + 0x80) + 0xe),
                                              &stack0xffffffffffffff50);
                        *(time_t *)(onread + 0xb8) = tVar10;
                        if (((ulong)conn_local[2].recv[0] >> 9 & 1) != 0) {
                          conn_local[3].proxy_ssl_config.version = *(long *)(onread + 0xb8);
                        }
                      }
                    }
                    else {
                      Curl_share_lock((Curl_easy *)conn_local,CURL_LOCK_DATA_COOKIE,
                                      CURL_LOCK_ACCESS_SINGLE);
                      if (nread_local[0x88] == 0) {
                        local_100 = (char *)nread_local[0x1a];
                      }
                      else {
                        local_100 = (char *)nread_local[0x88];
                      }
                      Curl_cookie_add((Curl_easy *)conn_local,
                                      *(CookieInfo **)&conn_local[2].ssl[0].field_0x10,true,false,
                                      (char *)(*(long *)(onread + 0x80) + 0xb),local_100,
                                      *(char **)conn_local[3].proxy_ssl,
                                      (*(uint *)(nread_local[0x7a] + 0x80) & 2) != 0);
                      Curl_share_unlock((Curl_easy *)conn_local,CURL_LOCK_DATA_COOKIE);
                    }
                  }
                  else {
                    secs = *(long *)(onread + 0x80) + 0xe;
                    while( true ) {
                      bVar12 = false;
                      if (*(char *)secs != '\0') {
                        iVar5 = Curl_isdigit((uint)*(byte *)secs);
                        bVar12 = false;
                        if (iVar5 == 0) {
                          bVar12 = *(char *)secs != '*';
                        }
                      }
                      if (!bVar12) break;
                      secs = secs + 1;
                    }
                    iVar5 = Curl_isdigit((uint)*(byte *)secs);
                    if (iVar5 == 0) {
                      conn_local[3].created.tv_sec = 0;
                    }
                    else {
                      CVar7 = curlx_strtoofft((char *)secs,(char **)0x0,10,
                                              (curl_off_t *)(onread + 0x88));
                      if ((CVar7 == CURL_OFFT_OK) &&
                         (conn_local[3].created.tv_sec == *(long *)(onread + 0x88))) {
                        *(ushort *)(onread + 0x570) = *(ushort *)(onread + 0x570) & 0xfffd | 2;
                      }
                    }
                  }
                }
                else {
                  CVar8 = Curl_build_unencoding_stack
                                    ((connectdata *)nread_local,
                                     (char *)(*(long *)(onread + 0x80) + 0x11),0);
                  if (CVar8 != CURLE_OK) {
                    return CVar8;
                  }
                  k._4_4_ = CURLE_OK;
                }
              }
              else {
                CVar8 = Curl_build_unencoding_stack
                                  ((connectdata *)nread_local,
                                   (char *)(*(long *)(onread + 0x80) + 0x12),1);
                if (CVar8 != CURLE_OK) {
                  return CVar8;
                }
                k._4_4_ = CURLE_OK;
              }
            }
          }
        }
        else {
          ptr = Curl_copy_header_value(*(char **)(onread + 0x80));
          if (ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          if (*ptr == '\0') {
            (*Curl_cfree)(ptr);
          }
          else {
            (*Curl_cfree)(conn_local[3].proxy_ssl_config.egdsocket);
            conn_local[3].proxy_ssl_config.egdsocket = (char *)0x0;
            conn_local[3].proxy_ssl_config.egdsocket = ptr;
          }
        }
      }
      st_1 = STATUS_BAD;
      if (((ulong)conn_local[2].recv[0] >> 0x19 & 1) != 0) {
        st_1 = STATUS_BAD|STATUS_DONE;
      }
      if (((ulong)conn_local[2].recv[0] >> 0x1e & 1) != 0) {
        Curl_debug((Curl_easy *)conn_local,CURLINFO_HEADER_IN,*(char **)(onread + 0x80),
                   *(size_t *)(onread + 0x60));
      }
      CVar8 = Curl_client_write((connectdata *)nread_local,st_1,*(char **)(onread + 0x80),
                                *(size_t *)(onread + 0x60));
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      conn_local[3].proxy_ssl_config.version_max =
           *(long *)(onread + 0x60) + conn_local[3].proxy_ssl_config.version_max;
      (conn_local->socks_proxy).host.rawalloc =
           (conn_local->socks_proxy).host.rawalloc + *(long *)(onread + 0x60);
      *(curl_llist_element **)(onread + 0x58) = conn_local[2].easyq.tail;
      *(undefined8 *)(onread + 0x60) = 0;
      k._4_4_ = CURLE_OK;
    }
    if (**(char **)(onread + 0x68) == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       ssize_t *nread,
                                       bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    k->str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    k->end_ptr = memchr(k->str_start, 0x0a, *nread);

    if(!k->end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = header_append(data, k, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st = checkprotoprefix(data, conn, data->state.headerbuff,
                                         k->hbuflen);
        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed\n");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (k->end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = k->end_ptr + 1; /* move past new line */

    full_length = k->str - k->str_start;

    result = header_append(data, k, full_length);
    if(result)
      return result;

    k->end_ptr = k->hbufp;
    k->p = data->state.headerbuff;

    /****
     * We now have a FULL header line that p points to
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn, data->state.headerbuff,
                                       k->hbuflen);
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed\n");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so
       use 0x0a and 0x0d instead of '\n' and '\r' */
    if((0x0a == *k->p) || (0x0d == *k->p)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

#ifdef CURL_DOES_CONVERSIONS
      if(0x0d == *k->p) {
        *k->p = '\r'; /* replace with CR in host encoding */
        k->p++;       /* pass the CR byte */
      }
      if(0x0a == *k->p) {
        *k->p = '\n'; /* replace with LF in host encoding */
        k->p++;       /* pass the LF byte */
      }
#else
      if('\r' == *k->p)
        k->p++; /* pass the \r byte */
      if('\n' == *k->p)
        k->p++; /* pass the \n byte */
#endif /* CURL_DOES_CONVERSIONS */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_REQUESTED) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101\n");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(conn, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
          else {
            /* Switching to another protocol (e.g. WebSocket) */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->set.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end\n");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)\n");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)\n");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif
      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(conn)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER;
      if(data->set.include_header)
        writetype |= CLIENTWRITE_BODY;

      headerlen = k->p - data->state.headerbuff;

      result = Curl_client_write(conn, writetype,
                                 data->state.headerbuff,
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(conn);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->set.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending\n");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending\n");
                streamclose(conn, "Stop sending data before everything sent");
                k->upload_done = TRUE;
                k->keepon &= ~KEEP_SEND; /* don't send */
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away!\n");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif
        else {
          /* If we know the expected size of this document, we set the
             maximum download size to the size of the expected
             document or else, we won't know when to stop reading!

             Note that we set the download maximum even if we read a
             "Connection: close" header, to make sure that
             "Content-Length: 0" still prevents us from attempting to
             read the (missing) response-body.
          */
          /* According to RFC2616 section 4.4, we MUST ignore
             Content-Length: headers if we are now receiving data
             using chunked Transfer-Encoding.
          */
          if(k->chunk)
            k->maxdownload = k->size = -1;
        }
        if(-1 != k->size) {
          /* We do this operation even if no_body is true, since this
             data might be retrieved later with curl_easy_getinfo()
             and its CURLINFO_CONTENT_LENGTH_DOWNLOAD option. */

          Curl_pgrsSetDownloadSize(data, k->size);
          k->maxdownload = k->size;
        }

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     k->str_start, headerlen);
        break;          /* exit header line loop */
      }

      /* We continue reading headers, so reset the line-based
         header parsing variables hbufp && hbuflen */
      k->hbufp = data->state.headerbuff;
      k->hbuflen = 0;
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#ifdef CURL_DOES_CONVERSIONS
#define HEADER1 scratch
#define SCRATCHSIZE 21
      CURLcode res;
      char scratch[SCRATCHSIZE + 1]; /* "HTTP/major.minor 123" */
      /* We can't really convert this yet because we
         don't know if it's the 1st header line or the body.
         So we do a partial conversion into a scratch area,
         leaving the data at k->p as-is.
      */
      strncpy(&scratch[0], k->p, SCRATCHSIZE);
      scratch[SCRATCHSIZE] = 0; /* null terminate */
      res = Curl_convert_from_network(data,
                                      &scratch[0],
                                      SCRATCHSIZE);
      if(res)
        /* Curl_convert_from_network calls failf if unsuccessful */
        return res;
#else
#define HEADER1 k->p /* no conversion needed, just use k->p */
#endif /* CURL_DOES_CONVERSIONS */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://tools.ietf.org/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We try to allow any number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d",
                    &httpversion_major,
                    &conn->httpversion,
                    &separator,
                    &k->httpcode);

        if(nc == 1 && httpversion_major == 2 &&
           1 == sscanf(HEADER1, " HTTP/2 %d", &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        if((nc == 4) && (' ' == separator)) {
          conn->httpversion += 10 * httpversion_major;

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2\n");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse\n");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            if(checkhttpprefix(data, k->p, k->hbuflen) == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response\n");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &conn->rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->rtspversion += 10 * rtspversion_major;
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        data->info.httpcode = k->httpcode;

        data->info.httpversion = conn->httpversion;
        if(!data->state.httpversion ||
           data->state.httpversion > conn->httpversion)
          /* store the lowest server version we encounter */
          data->state.httpversion = conn->httpversion;

        /*
         * This code executes as part of processing the header.  As a
         * result, it's not totally clear how to interpret the
         * response code yet as that depends on what other headers may
         * be present.  401 and 407 may be errors, but may be OK
         * depending on how authentication is working.  Other codes
         * are definitely errors, so give up here.
         */
        if(data->state.resume_from && data->set.httpreq == HTTPREQ_GET &&
             k->httpcode == 416) {
          /* "Requested Range Not Satisfiable", just proceed and
             pretend this is no error */
          k->ignorebody = TRUE; /* Avoid appending error msg to good data. */
        }
        else if(data->set.http_fail_on_error && (k->httpcode >= 400) &&
           ((k->httpcode != 401) || !conn->bits.user_passwd) &&
           ((k->httpcode != 407) || !conn->bits.proxy_user_passwd) ) {
          /* serious error, go home! */
          print_http_error(data);
          return CURLE_HTTP_RETURNED_ERROR;
        }

        if(conn->httpversion == 10) {
          /* Default action for HTTP/1.0 must be to close, unless
             we get one of those fancy headers that tell us the
             server keeps it open for us! */
          infof(data, "HTTP 1.0, assume close after body\n");
          connclose(conn, "HTTP/1.0 close after body");
        }
        else if(conn->httpversion == 20 ||
                (k->upgr101 == UPGR101_REQUESTED && k->httpcode == 101)) {
          DEBUGF(infof(data, "HTTP/2 found, allow multiplexing\n"));

          /* HTTP/2 cannot blacklist multiplexing since it is a core
             functionality of the protocol */
          conn->bundle->multiuse = BUNDLE_MULTIPLEX;
        }
        else if(conn->httpversion >= 11 &&
                !conn->bits.close) {
          /* If HTTP version is >= 1.1 and connection is persistent */
          DEBUGF(infof(data,
                       "HTTP 1.1 or later with persistent connection\n"));
        }

        switch(k->httpcode) {
        case 304:
          /* (quote from RFC2616, section 10.3.5): The 304 response
           * MUST NOT contain a message-body, and thus is always
           * terminated by the first empty line after the header
           * fields.  */
          if(data->set.timecondition)
            data->info.timecond = TRUE;
          /* FALLTHROUGH */
        case 204:
          /* (quote from RFC2616, section 10.2.5): The server has
           * fulfilled the request but does not need to return an
           * entity-body ... The 204 response MUST NOT include a
           * message-body, and thus is always terminated by the first
           * empty line after the header fields. */
          k->size = 0;
          k->maxdownload = 0;
          k->ignorecl = TRUE; /* ignore Content-Length headers */
          break;
        default:
          /* nothing */
          break;
        }
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = Curl_convert_from_network(data, k->p, strlen(k->p));
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

    /* Check for Content-Length: header lines to get size */
    if(!k->ignorecl && !data->set.ignorecl &&
       checkprefix("Content-Length:", k->p)) {
      curl_off_t contentlength;
      CURLofft offt = curlx_strtoofft(k->p + 15, NULL, 10, &contentlength);

      if(offt == CURL_OFFT_OK) {
        if(data->set.max_filesize &&
           contentlength > data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        k->size = contentlength;
        k->maxdownload = k->size;
        /* we set the progress download size already at this point
           just to make it easier for apps/callbacks to extract this
           info as soon as possible */
        Curl_pgrsSetDownloadSize(data, k->size);
      }
      else if(offt == CURL_OFFT_FLOW) {
        /* out of range */
        if(data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        streamclose(conn, "overflow content-length");
        infof(data, "Overflow Content-Length: value!\n");
      }
      else {
        /* negative or just rubbish - bad HTTP */
        failf(data, "Invalid Content-Length: value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
    /* check for Content-Type: header lines to get the MIME-type */
    else if(checkprefix("Content-Type:", k->p)) {
      char *contenttype = Curl_copy_header_value(k->p);
      if(!contenttype)
        return CURLE_OUT_OF_MEMORY;
      if(!*contenttype)
        /* ignore empty data */
        free(contenttype);
      else {
        Curl_safefree(data->info.contenttype);
        data->info.contenttype = contenttype;
      }
    }
    else if((conn->httpversion == 10) &&
            conn->bits.httpproxy &&
            Curl_compareheader(k->p,
                               "Proxy-Connection:", "keep-alive")) {
      /*
       * When a HTTP/1.0 reply comes when using a proxy, the
       * 'Proxy-Connection: keep-alive' line tells us the
       * connection will be kept alive for our pleasure.
       * Default action for 1.0 is to close.
       */
      connkeep(conn, "Proxy-Connection keep-alive"); /* don't close */
      infof(data, "HTTP/1.0 proxy connection set to keep alive!\n");
    }
    else if((conn->httpversion == 11) &&
            conn->bits.httpproxy &&
            Curl_compareheader(k->p,
                               "Proxy-Connection:", "close")) {
      /*
       * We get a HTTP/1.1 response from a proxy and it says it'll
       * close down after this transfer.
       */
      connclose(conn, "Proxy-Connection: asked to close after done");
      infof(data, "HTTP/1.1 proxy connection set close!\n");
    }
    else if((conn->httpversion == 10) &&
            Curl_compareheader(k->p, "Connection:", "keep-alive")) {
      /*
       * A HTTP/1.0 reply with the 'Connection: keep-alive' line
       * tells us the connection will be kept alive for our
       * pleasure.  Default action for 1.0 is to close.
       *
       * [RFC2068, section 19.7.1] */
      connkeep(conn, "Connection keep-alive");
      infof(data, "HTTP/1.0 connection set to keep alive!\n");
    }
    else if(Curl_compareheader(k->p, "Connection:", "close")) {
      /*
       * [RFC 2616, section 8.1.2.1]
       * "Connection: close" is HTTP/1.1 language and means that
       * the connection will close when this request has been
       * served.
       */
      streamclose(conn, "Connection: close used");
    }
    else if(checkprefix("Transfer-Encoding:", k->p)) {
      /* One or more encodings. We check for chunked and/or a compression
         algorithm. */
      /*
       * [RFC 2616, section 3.6.1] A 'chunked' transfer encoding
       * means that the server will send a series of "chunks". Each
       * chunk starts with line with info (including size of the
       * coming block) (terminated with CRLF), then a block of data
       * with the previously mentioned size. There can be any amount
       * of chunks, and a chunk-data set to zero signals the
       * end-of-chunks. */

      result = Curl_build_unencoding_stack(conn, k->p + 18, TRUE);
      if(result)
        return result;
    }
    else if(checkprefix("Content-Encoding:", k->p) &&
            data->set.str[STRING_ENCODING]) {
      /*
       * Process Content-Encoding. Look for the values: identity,
       * gzip, deflate, compress, x-gzip and x-compress. x-gzip and
       * x-compress are the same as gzip and compress. (Sec 3.5 RFC
       * 2616). zlib cannot handle compress.  However, errors are
       * handled further down when the response body is processed
       */
      result = Curl_build_unencoding_stack(conn, k->p + 17, FALSE);
      if(result)
        return result;
    }
    else if(checkprefix("Content-Range:", k->p)) {
      /* Content-Range: bytes [num]-
         Content-Range: bytes: [num]-
         Content-Range: [num]-
         Content-Range: [asterisk]/[total]

         The second format was added since Sun's webserver
         JavaWebServer/1.1.1 obviously sends the header this way!
         The third added since some servers use that!
         The forth means the requested range was unsatisfied.
      */

      char *ptr = k->p + 14;

      /* Move forward until first digit or asterisk */
      while(*ptr && !ISDIGIT(*ptr) && *ptr != '*')
        ptr++;

      /* if it truly stopped on a digit */
      if(ISDIGIT(*ptr)) {
        if(!curlx_strtoofft(ptr, NULL, 10, &k->offset)) {
          if(data->state.resume_from == k->offset)
            /* we asked for a resume and we got it */
            k->content_range = TRUE;
        }
      }
      else
        data->state.resume_from = 0; /* get everything */
    }
#if !defined(CURL_DISABLE_COOKIES)
    else if(data->cookies &&
            checkprefix("Set-Cookie:", k->p)) {
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE,
                      CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add(data,
                      data->cookies, TRUE, FALSE, k->p + 11,
                      /* If there is a custom-set Host: name, use it
                         here, or else use real peer host name. */
                      conn->allocptr.cookiehost?
                      conn->allocptr.cookiehost:conn->host.name,
                      data->state.up.path,
                      (conn->handler->protocol&CURLPROTO_HTTPS)?
                      TRUE:FALSE);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
#endif
    else if(checkprefix("Last-Modified:", k->p) &&
            (data->set.timecondition || data->set.get_filetime) ) {
      time_t secs = time(NULL);
      k->timeofdoc = curl_getdate(k->p + strlen("Last-Modified:"),
                                  &secs);
      if(data->set.get_filetime)
        data->info.filetime = k->timeofdoc;
    }
    else if((checkprefix("WWW-Authenticate:", k->p) &&
             (401 == k->httpcode)) ||
            (checkprefix("Proxy-authenticate:", k->p) &&
             (407 == k->httpcode))) {

      bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
      char *auth = Curl_copy_header_value(k->p);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;

      result = Curl_http_input_auth(conn, proxy, auth);

      free(auth);

      if(result)
        return result;
    }
  #ifdef USE_SPNEGO
    else if(checkprefix("Persistent-Auth", k->p)) {
      struct negotiatedata *negdata = &conn->negotiate;
      struct auth *authp = &data->state.authhost;
      if(authp->picked == CURLAUTH_NEGOTIATE) {
        char *persistentauth = Curl_copy_header_value(k->p);
        if(!persistentauth)
          return CURLE_OUT_OF_MEMORY;
        negdata->noauthpersist = checkprefix("false", persistentauth);
        negdata->havenoauthpersist = TRUE;
        infof(data, "Negotiate: noauthpersist -> %d, header part: %s",
          negdata->noauthpersist, persistentauth);
        free(persistentauth);
      }
    }
  #endif
    else if((k->httpcode >= 300 && k->httpcode < 400) &&
            checkprefix("Location:", k->p) &&
            !data->req.location) {
      /* this is the URL that the server advises us to use instead */
      char *location = Curl_copy_header_value(k->p);
      if(!location)
        return CURLE_OUT_OF_MEMORY;
      if(!*location)
        /* ignore empty data */
        free(location);
      else {
        data->req.location = location;

        if(data->set.http_follow_location) {
          DEBUGASSERT(!data->req.newurl);
          data->req.newurl = strdup(data->req.location); /* clone */
          if(!data->req.newurl)
            return CURLE_OUT_OF_MEMORY;

          /* some cases of POST and PUT etc needs to rewind the data
             stream at this point */
          result = http_perhapsrewind(conn);
          if(result)
            return result;
        }
      }
    }
#ifdef USE_ALTSVC
    /* If enabled, the header is incoming and this is over HTTPS */
    else if(data->asi && checkprefix("Alt-Svc:", k->p) &&
            ((conn->handler->flags & PROTOPT_SSL) ||
#ifdef CURLDEBUG
             /* allow debug builds to circumvent the HTTPS restriction */
             getenv("CURL_ALTSVC_HTTP")
#else
             0
#endif
              )) {
      /* the ALPN of the current request */
      enum alpnid id = (conn->httpversion == 20) ? ALPN_h2 : ALPN_h1;
      result = Curl_altsvc_parse(data, data->asi,
                                 &k->p[ strlen("Alt-Svc:") ],
                                 id, conn->host.name,
                                 curlx_uitous(conn->remote_port));
      if(result)
        return result;
    }
#endif
    else if(conn->handler->protocol & CURLPROTO_RTSP) {
      result = Curl_rtsp_parseheader(conn, k->p);
      if(result)
        return result;
    }

    /*
     * End of header-checks. Write them to the client.
     */

    writetype = CLIENTWRITE_HEADER;
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;

    if(data->set.verbose)
      Curl_debug(data, CURLINFO_HEADER_IN, k->p, (size_t)k->hbuflen);

    result = Curl_client_write(conn, writetype, k->p, k->hbuflen);
    if(result)
      return result;

    data->info.header_size += (long)k->hbuflen;
    data->req.headerbytecount += (long)k->hbuflen;

    /* reset hbufp pointer && hbuflen */
    k->hbufp = data->state.headerbuff;
    k->hbuflen = 0;
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}